

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O0

void http_on_request_handler______internal(http_s *h,http_settings_s *settings)

{
  FIOBJ hash;
  FIOBJ key;
  int iVar1;
  FIOBJ FVar2;
  size_t sVar3;
  uint64_t key_hash;
  undefined1 local_58 [8];
  fio_str_info_s val;
  fio_str_info_s path_str;
  FIOBJ t;
  FIOBJ tmp;
  http_settings_s *settings_local;
  http_s *h_local;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fiobj_hash_string("upgrade",7);
  }
  h->udata = settings->udata;
  if (http_on_request_handler______internal::host_hash == 0) {
    http_on_request_handler______internal::host_hash = fiobj_hash_string("host",4);
  }
  FVar2 = fiobj_hash_get2(h->headers,http_on_request_handler______internal::host_hash);
  if (FVar2 == 0) {
    if (4 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http_internal.c:72): missing Host header"
                    );
    }
    http_send_error(h,400);
  }
  else {
    sVar3 = fiobj_type_is(FVar2,FIOBJ_T_ARRAY);
    key = HTTP_HEADER_HOST;
    if (sVar3 != 0) {
      hash = h->headers;
      FVar2 = fiobj_ary_pop(FVar2);
      fiobj_hash_set(hash,key,FVar2);
    }
    FVar2 = fiobj_hash_get2(h->headers,http_upgrade_hash);
    if (FVar2 == 0) {
      FVar2 = h->headers;
      key_hash = fiobj_obj2hash(HTTP_HEADER_ACCEPT);
      FVar2 = fiobj_hash_get2(FVar2,key_hash);
      iVar1 = fiobj_iseq(FVar2,HTTP_HVALUE_SSE_MIME);
      if (iVar1 == 0) {
        if (settings->public_folder != (char *)0x0) {
          fiobj_obj2cstr((fio_str_info_s *)&val.data,h->path);
          iVar1 = http_sendfile2(h,settings->public_folder,settings->public_folder_length,
                                 (char *)path_str.len,path_str.capa);
          if (iVar1 == 0) {
            return;
          }
        }
        (*settings->on_request)(h);
      }
      else {
        (*settings->on_upgrade)(h,"sse",3);
      }
    }
    else {
      fiobj_dup(FVar2);
      fiobj_obj2cstr((fio_str_info_s *)local_58,FVar2);
      if ((*(char *)val.len == 'h') && (*(char *)(val.len + 1) == '2')) {
        http_send_error(h,400);
      }
      else {
        (*settings->on_upgrade)(h,(char *)val.len,val.capa);
      }
      fiobj_free(FVar2);
    }
  }
  return;
}

Assistant:

void http_on_request_handler______internal(http_s *h,
                                           http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;

  static uint64_t host_hash = 0;
  if (!host_hash)
    host_hash = fiobj_hash_string("host", 4);

  if (1) {
    /* test for Host header and avoid duplicates */
    FIOBJ tmp = fiobj_hash_get2(h->headers, host_hash);
    if (!tmp)
      goto missing_host;
    if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY)) {
      fiobj_hash_set(h->headers, HTTP_HEADER_HOST, fiobj_ary_pop(tmp));
    }
  }

  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t)
    goto upgrade;

  if (fiobj_iseq(
          fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_ACCEPT)),
          HTTP_HVALUE_SSE_MIME))
    goto eventsource;
  if (settings->public_folder) {
    fio_str_info_s path_str = fiobj_obj2cstr(h->path);
    if (!http_sendfile2(h, settings->public_folder,
                        settings->public_folder_length, path_str.data,
                        path_str.len)) {
      return;
    }
  }
  settings->on_request(h);
  return;

upgrade:
  if (1) {
    fiobj_dup(t); /* allow upgrade name access after http_finish */
    fio_str_info_s val = fiobj_obj2cstr(t);
    if (val.data[0] == 'h' && val.data[1] == '2') {
      http_send_error(h, 400);
    } else {
      settings->on_upgrade(h, val.data, val.len);
    }
    fiobj_free(t);
    return;
  }
eventsource:
  settings->on_upgrade(h, (char *)"sse", 3);
  return;
missing_host:
  FIO_LOG_DEBUG("missing Host header");
  http_send_error(h, 400);
  return;
}